

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall GlobalMemoryAllocatorStash::save(GlobalMemoryAllocatorStash *this)

{
  TestMemoryAllocator *pTVar1;
  undefined8 *in_RDI;
  
  pTVar1 = getCurrentMallocAllocator();
  *in_RDI = pTVar1;
  pTVar1 = getCurrentNewAllocator();
  in_RDI[1] = pTVar1;
  pTVar1 = getCurrentNewArrayAllocator();
  in_RDI[2] = pTVar1;
  return;
}

Assistant:

void GlobalMemoryAllocatorStash::save()
{
    originalMallocAllocator = getCurrentMallocAllocator();
    originalNewAllocator = getCurrentNewAllocator();
    originalNewArrayAllocator = getCurrentNewArrayAllocator();
}